

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2.cc
# Opt level: O3

void __thiscall
re2::FilteredRE2::Compile
          (FilteredRE2 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atoms)

{
  pointer ppRVar1;
  Prefilter *f;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  LogMessage LStack_198;
  
  if ((this->compiled_ == false) &&
     (ppRVar1 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>._M_impl
                .super__Vector_impl_data._M_start,
     (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>._M_impl.
     super__Vector_impl_data._M_finish != ppRVar1)) {
    uVar3 = 0;
    do {
      f = Prefilter::FromRE2(ppRVar1[uVar3]);
      PrefilterTree::Add(this->prefilter_tree_,f);
      uVar3 = uVar3 + 1;
      ppRVar1 = (this->re2_vec_).super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->re2_vec_).
                                   super__Vector_base<re2::RE2_*,_std::allocator<re2::RE2_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(atoms);
    PrefilterTree::Compile(this->prefilter_tree_,atoms);
    this->compiled_ = true;
  }
  else {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/filtered_re2.cc"
               ,0x2d,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_198.str_,"C: ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(&LStack_198.str_,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," S:",3);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    LogMessage::~LogMessage(&LStack_198);
  }
  return;
}

Assistant:

void FilteredRE2::Compile(vector<string>* atoms) {
  if (compiled_ || re2_vec_.size() == 0) {
    LOG(INFO) << "C: " << compiled_ << " S:" << re2_vec_.size();
    return;
  }

  for (size_t i = 0; i < re2_vec_.size(); i++) {
    Prefilter* prefilter = Prefilter::FromRE2(re2_vec_[i]);
    prefilter_tree_->Add(prefilter);
  }
  atoms->clear();
  prefilter_tree_->Compile(atoms);
  compiled_ = true;
}